

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*>
fmt::v7::detail::format_decimal<char,unsigned_int>(char *out,uint value,int size)

{
  int iVar1;
  char *pcVar2;
  format_decimal_result<char_*> fVar3;
  
  iVar1 = count_digits(value);
  if (iVar1 <= size) {
    pcVar2 = out + (long)size + -2;
    for (; 99 < value; value = value / 100) {
      *(undefined2 *)pcVar2 = *(undefined2 *)(basic_data<void>::digits + ((ulong)value % 100) * 2);
      pcVar2 = pcVar2 + -2;
    }
    if (value < 10) {
      pcVar2[1] = (byte)value | 0x30;
      pcVar2 = pcVar2 + 1;
    }
    else {
      *(undefined2 *)pcVar2 = *(undefined2 *)(basic_data<void>::digits + (ulong)value * 2);
    }
    fVar3.end = out + size;
    fVar3.begin = pcVar2;
    return fVar3;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
              ,0x41b,"invalid digit count");
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}